

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

shared_ptr<duckdb::RowVersionManager,_true> __thiscall
duckdb::RowGroup::GetOrCreateVersionInfoInternal(RowGroup *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RowGroup *in_RSI;
  element_type *in_RDI;
  shared_ptr<duckdb::RowVersionManager,_true> sVar2;
  shared_ptr<duckdb::RowVersionManager,_true> new_info;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  element_type *version;
  unsigned_long *in_stack_ffffffffffffffc8;
  
  version = in_RDI;
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff98);
  bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::RowVersionManager,_true> *)0xba9381);
  if (!bVar1) {
    make_shared_ptr<duckdb::RowVersionManager,unsigned_long&>(in_stack_ffffffffffffffc8);
    shared_ptr<duckdb::RowVersionManager,_true>::shared_ptr
              ((shared_ptr<duckdb::RowVersionManager,_true> *)in_RDI,
               (shared_ptr<duckdb::RowVersionManager,_true> *)in_stack_ffffffffffffff98);
    SetVersionInfo(in_RSI,(shared_ptr<duckdb::RowVersionManager,_true> *)version);
    shared_ptr<duckdb::RowVersionManager,_true>::~shared_ptr
              ((shared_ptr<duckdb::RowVersionManager,_true> *)0xba93c6);
    shared_ptr<duckdb::RowVersionManager,_true>::~shared_ptr
              ((shared_ptr<duckdb::RowVersionManager,_true> *)0xba93d0);
  }
  shared_ptr<duckdb::RowVersionManager,_true>::shared_ptr
            ((shared_ptr<duckdb::RowVersionManager,_true> *)in_RDI,
             (shared_ptr<duckdb::RowVersionManager,_true> *)in_stack_ffffffffffffff98);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xba9435);
  sVar2.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       version;
  return (shared_ptr<duckdb::RowVersionManager,_true>)
         sVar2.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowVersionManager> RowGroup::GetOrCreateVersionInfoInternal() {
	// version info does not exist - need to create it
	lock_guard<mutex> lock(row_group_lock);
	if (!owned_version_info) {
		auto new_info = make_shared_ptr<RowVersionManager>(start);
		SetVersionInfo(std::move(new_info));
	}
	return owned_version_info;
}